

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O3

void __thiscall Liby::Connection::Connection(Connection *this,EventLoop *loop,SockPtr *socket)

{
  _Head_base<0UL,_Liby::Poller_*,_false> _Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  (this->super_enable_shared_from_this<Liby::Connection>)._M_weak_this.
  super___weak_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<Liby::Connection>)._M_weak_this.
  super___weak_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  TimerMixin::TimerMixin(&this->super_TimerMixin);
  (this->super_TimerMixin)._vptr_TimerMixin = (_func_int **)&PTR__Connection_0012d828;
  (this->context_).super___shared_ptr<Liby::BaseContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->context_).super___shared_ptr<Liby::BaseContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->destroy_ = false;
  _Var1._M_head_impl =
       (loop->poller_)._M_t.super___uniq_ptr_impl<Liby::Poller,_std::default_delete<Liby::Poller>_>.
       _M_t.super__Tuple_impl<0UL,_Liby::Poller_*,_std::default_delete<Liby::Poller>_>.
       super__Head_base<0UL,_Liby::Poller_*,_false>._M_head_impl;
  if (_Var1._M_head_impl == (Poller *)0x0) {
    __assert_fail("poller_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/EventLoop.h"
                  ,0xf,"Poller *Liby::EventLoop::getPoller() const");
  }
  this->poller_ = _Var1._M_head_impl;
  this->loop_ = loop;
  (this->self_).super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->self_).super___shared_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->socket_).super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (socket->super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (socket->super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (this->socket_).super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  (this->chan_).super___shared_ptr<Liby::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->chan_).super___shared_ptr<Liby::Channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Buffer::Buffer(&this->readBuf_,0x400);
  (this->writTasks_).super__Deque_base<Liby::io_task,_std::allocator<Liby::io_task>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->writTasks_).super__Deque_base<Liby::io_task,_std::allocator<Liby::io_task>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->writTasks_).super__Deque_base<Liby::io_task,_std::allocator<Liby::io_task>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->writTasks_).super__Deque_base<Liby::io_task,_std::allocator<Liby::io_task>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->writTasks_).super__Deque_base<Liby::io_task,_std::allocator<Liby::io_task>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->writTasks_).super__Deque_base<Liby::io_task,_std::allocator<Liby::io_task>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->writTasks_).super__Deque_base<Liby::io_task,_std::allocator<Liby::io_task>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->writTasks_).super__Deque_base<Liby::io_task,_std::allocator<Liby::io_task>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->writTasks_).super__Deque_base<Liby::io_task,_std::allocator<Liby::io_task>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->writTasks_).super__Deque_base<Liby::io_task,_std::allocator<Liby::io_task>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<Liby::io_task,_std::allocator<Liby::io_task>_>::_M_initialize_map
            (&(this->writTasks_).super__Deque_base<Liby::io_task,_std::allocator<Liby::io_task>_>,0)
  ;
  (this->erroEventCallback_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->erroEventCallback_)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->erroEventCallback_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->erroEventCallback_).super__Function_base._M_functor + 8) = 0;
  (this->readEventCallback_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->readEventCallback_)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->readEventCallback_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->readEventCallback_).super__Function_base._M_functor + 8) = 0;
  if ((socket->super___shared_ptr<Liby::Socket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
      (element_type *)0x0) {
    return;
  }
  __assert_fail("socket",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Connection.cpp"
                ,0xc,"Liby::Connection::Connection(EventLoop *, const SockPtr &)");
}

Assistant:

Connection::Connection(EventLoop *loop, const SockPtr &socket)
    : poller_(loop->getPoller()), loop_(loop), socket_(socket), readBuf_(1024) {
    assert(socket);
}